

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O2

float If_CutDelay(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  char cVar1;
  If_Par_t *pIVar2;
  If_LibLut_t *pIVar3;
  uint uVar4;
  If_Obj_t *pIVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  uVar4 = *(uint *)&pCut->field_0x1c;
  if ((short)uVar4 < 0) {
    fVar9 = -1e+20;
    uVar8 = 0;
    while ((uVar8 < uVar4 >> 0x18 &&
           (pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar8]), pIVar5 != (If_Obj_t *)0x0))) {
      fVar10 = (float)p->pPars->nAndDelay + (pIVar5->CutBest).Delay;
      if (fVar9 <= fVar10) {
        fVar9 = fVar10;
      }
      uVar8 = uVar8 + 1;
      uVar4 = *(uint *)&pCut->field_0x1c;
    }
  }
  else {
    uVar6 = uVar4 >> 0x18;
    pIVar2 = p->pPars;
    pIVar3 = pIVar2->pLutLib;
    if (pIVar3 == (If_LibLut_t *)0x0) {
      if ((uVar4 >> 0xd & 1) == 0) {
        fVar9 = -1e+20;
        uVar8 = 0;
        if (pIVar2->fLiftLeaves == 0) {
          while ((uVar8 < uVar4 >> 0x18 &&
                 (pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar8]), pIVar5 != (If_Obj_t *)0x0))) {
            fVar10 = (pIVar5->CutBest).Delay + 1.0;
            if (fVar9 <= fVar10) {
              fVar9 = fVar10;
            }
            uVar8 = uVar8 + 1;
            uVar4 = *(uint *)&pCut->field_0x1c;
          }
        }
        else {
          while ((uVar8 < uVar4 >> 0x18 &&
                 (pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar8] >> 8), pIVar5 != (If_Obj_t *)0x0)
                 )) {
            fVar10 = ((pIVar5->CutBest).Delay -
                     (float)(int)((uint)*(byte *)(&pCut[1].Area + uVar8) * p->Period)) + 1.0;
            if (fVar9 <= fVar10) {
              fVar9 = fVar10;
            }
            uVar8 = uVar8 + 1;
            uVar4 = *(uint *)&pCut->field_0x1c;
          }
        }
      }
      else {
        if (pIVar2->fLiftLeaves != 0) {
          __assert_fail("!p->pPars->fLiftLeaves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                        ,0x88,"float If_CutDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
        }
        fVar9 = -1e+20;
        uVar8 = 0;
        while ((uVar8 < uVar4 >> 0x18 &&
               (pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar8]), pIVar5 != (If_Obj_t *)0x0))) {
          cVar1 = *(char *)((long)&pCut[1].Area + uVar8 + (ulong)uVar6 * 4);
          fVar10 = -120.0;
          if (cVar1 != 'x') {
            fVar10 = (float)(int)cVar1;
          }
          fVar10 = fVar10 + (pIVar5->CutBest).Delay;
          if (fVar9 <= fVar10) {
            fVar9 = fVar10;
          }
          uVar8 = uVar8 + 1;
          uVar4 = *(uint *)&pCut->field_0x1c;
        }
      }
    }
    else {
      if (pIVar2->fLiftLeaves != 0) {
        __assert_fail("!p->pPars->fLiftLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTime.c"
                      ,0x6f,"float If_CutDelay(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      if (pIVar3->fVarPinDelays == 0) {
        fVar9 = -1e+20;
        uVar8 = 0;
        while ((uVar8 < uVar4 >> 0x18 &&
               (pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar8]), pIVar5 != (If_Obj_t *)0x0))) {
          fVar10 = (pIVar5->CutBest).Delay + pIVar3->pLutDelays[uVar6][0];
          if (fVar9 <= fVar10) {
            fVar9 = fVar10;
          }
          uVar8 = uVar8 + 1;
          uVar4 = *(uint *)&pCut->field_0x1c;
        }
      }
      else {
        If_CutSortInputPins(p,pCut,If_CutDelay::pPinPerm,If_CutDelay::pPinDelays);
        fVar9 = -1e+20;
        for (lVar7 = 0; (ulong)(byte)pCut->field_0x1f * 4 != lVar7; lVar7 = lVar7 + 4) {
          fVar10 = If_CutDelay::pPinDelays[*(int *)((long)If_CutDelay::pPinPerm + lVar7)] +
                   *(float *)((long)pIVar3->pLutDelays[uVar6] + lVar7);
          if (fVar9 <= fVar10) {
            fVar9 = fVar10;
          }
        }
      }
    }
  }
  return fVar9;
}

Assistant:

float If_CutDelay( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    static int pPinPerm[IF_MAX_LUTSIZE];
    static float pPinDelays[IF_MAX_LUTSIZE];
    char * pPerm = If_CutPerm( pCut );
    If_Obj_t * pLeaf;
    float Delay, DelayCur;
    float * pLutDelays;
    int i, Shift, Pin2PinDelay;//, iLeaf;
    Delay = -IF_FLOAT_LARGE;
    if ( pCut->fAndCut )
    {
        If_CutForEachLeaf( p, pCut, pLeaf, i )
        {
            DelayCur = If_ObjCutBest(pLeaf)->Delay + p->pPars->nAndDelay;
            Delay = IF_MAX( Delay, DelayCur );
        }
    }
    else if ( p->pPars->pLutLib )
    {
        assert( !p->pPars->fLiftLeaves );
        pLutDelays = p->pPars->pLutLib->pLutDelays[pCut->nLeaves];
        if ( p->pPars->pLutLib->fVarPinDelays )
        {
            // compute the delay using sorted pins
            If_CutSortInputPins( p, pCut, pPinPerm, pPinDelays );
            for ( i = 0; i < (int)pCut->nLeaves; i++ )
            {
                DelayCur = pPinDelays[pPinPerm[i]] + pLutDelays[i];
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
        else
        {
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                DelayCur = If_ObjCutBest(pLeaf)->Delay + pLutDelays[0];
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
    }
    else
    {
        if ( pCut->fUser )
        {
            assert( !p->pPars->fLiftLeaves );
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                Pin2PinDelay = pPerm ? (pPerm[i] == IF_BIG_CHAR ? -IF_BIG_CHAR : pPerm[i]) : 1;
                DelayCur = If_ObjCutBest(pLeaf)->Delay + (float)Pin2PinDelay;
                Delay = IF_MAX( Delay, DelayCur );
            }
        }
        else
        {
            if ( p->pPars->fLiftLeaves )
            {
                If_CutForEachLeafSeq( p, pCut, pLeaf, Shift, i )
                {
                    DelayCur = If_ObjCutBest(pLeaf)->Delay - Shift * p->Period;
                    Delay = IF_MAX( Delay, DelayCur + 1.0 );
                }
            }
            else
            {
                If_CutForEachLeaf( p, pCut, pLeaf, i )
                {
                    DelayCur = If_ObjCutBest(pLeaf)->Delay + 1.0;
                    Delay = IF_MAX( Delay, DelayCur );
                }
            }
        }
    }
    return Delay;
}